

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int gc_traverse_tab(global_State *g,GCtab *t)

{
  char cVar1;
  uint uVar2;
  GCobj *o;
  uint64_t uVar3;
  ulong *puVar4;
  char *pcVar5;
  cTValue *local_80;
  cTValue *local_78;
  Node *n;
  MSize hmask;
  MSize i_1;
  Node *node;
  MSize asize;
  MSize i;
  CTState *cts;
  char *pcStack_40;
  int c;
  char *modestr;
  GCtab *mt;
  cTValue *mode;
  int weak;
  GCtab *t_local;
  global_State *g_local;
  
  mode._4_4_ = 0;
  o = (GCobj *)(t->metatable).gcptr64;
  if ((o != (GCobj *)0x0) && (((o->gch).marked & 3) != 0)) {
    gc_mark(g,o);
  }
  if (o == (GCobj *)0x0) {
    local_78 = (cTValue *)0x0;
  }
  else {
    if (((o->gch).unused1 & 8) == 0) {
      local_80 = lj_meta_cache(&o->tab,MM_mode,(GCstr *)g->gcroot[3].gcptr64);
    }
    else {
      local_80 = (cTValue *)0x0;
    }
    local_78 = local_80;
  }
  if ((local_78 != (cTValue *)0x0) && ((int)(local_78->field_4).it >> 0xf == -5)) {
    pcStack_40 = (char *)((local_78->u64 & 0x7fffffffffff) + 0x18);
    while( true ) {
      pcVar5 = pcStack_40 + 1;
      cVar1 = *pcStack_40;
      if (cVar1 == '\0') break;
      pcStack_40 = pcVar5;
      if (cVar1 == 'k') {
        mode._4_4_ = mode._4_4_ | 8;
      }
      else if (cVar1 == 'v') {
        mode._4_4_ = mode._4_4_ | 0x10;
      }
    }
    if (mode._4_4_ != 0) {
      uVar3 = (g->ctype_state).ptr64;
      if ((uVar3 == 0) || (*(GCtab **)(uVar3 + 0x20) != t)) {
        t->marked = t->marked & 0xe7 | (byte)mode._4_4_;
        (t->gclist).gcptr64 = (g->gc).weak.gcptr64;
        (g->gc).weak.gcptr64 = (uint64_t)t;
      }
      else {
        mode._4_4_ = 0xffffffef;
      }
    }
  }
  if (mode._4_4_ == 0x18) {
    g_local._4_4_ = 1;
  }
  else {
    if ((mode._4_4_ & 0x10) == 0) {
      uVar2 = t->asize;
      for (node._4_4_ = 0; node._4_4_ < uVar2; node._4_4_ = node._4_4_ + 1) {
        if ((0xfffffff6 <
             (int)((long)*(undefined8 *)((t->array).ptr64 + (ulong)node._4_4_ * 8) >> 0x2f) + 4U) &&
           ((*(byte *)((*(ulong *)((t->array).ptr64 + (ulong)node._4_4_ * 8) & 0x7fffffffffff) + 8)
            & 3) != 0)) {
          gc_mark(g,(GCobj *)(*(ulong *)((t->array).ptr64 + (ulong)node._4_4_ * 8) & 0x7fffffffffff)
                 );
        }
      }
    }
    if (t->hmask != 0) {
      uVar3 = (t->node).ptr64;
      uVar2 = t->hmask;
      for (n._4_4_ = 0; n._4_4_ <= uVar2; n._4_4_ = n._4_4_ + 1) {
        puVar4 = (ulong *)(uVar3 + (ulong)n._4_4_ * 0x18);
        if (*puVar4 != 0xffffffffffffffff) {
          if ((((mode._4_4_ & 8) == 0) && (0xfffffff6 < (int)((long)puVar4[1] >> 0x2f) + 4U)) &&
             ((*(byte *)((puVar4[1] & 0x7fffffffffff) + 8) & 3) != 0)) {
            gc_mark(g,(GCobj *)(puVar4[1] & 0x7fffffffffff));
          }
          if ((((mode._4_4_ & 0x10) == 0) && (0xfffffff6 < (int)((long)*puVar4 >> 0x2f) + 4U)) &&
             ((*(byte *)((*puVar4 & 0x7fffffffffff) + 8) & 3) != 0)) {
            gc_mark(g,(GCobj *)(*puVar4 & 0x7fffffffffff));
          }
        }
      }
    }
    g_local._4_4_ = mode._4_4_;
  }
  return g_local._4_4_;
}

Assistant:

static int gc_traverse_tab(global_State *g, GCtab *t)
{
  int weak = 0;
  cTValue *mode;
  GCtab *mt = tabref(t->metatable);
  if (mt)
    gc_markobj(g, mt);
  mode = lj_meta_fastg(g, mt, MM_mode);
  if (mode && tvisstr(mode)) {  /* Valid __mode field? */
    const char *modestr = strVdata(mode);
    int c;
    while ((c = *modestr++)) {
      if (c == 'k') weak |= LJ_GC_WEAKKEY;
      else if (c == 'v') weak |= LJ_GC_WEAKVAL;
    }
    if (weak) {  /* Weak tables are cleared in the atomic phase. */
#if LJ_HASFFI
      CTState *cts = ctype_ctsG(g);
      if (cts && cts->finalizer == t) {
	weak = (int)(~0u & ~LJ_GC_WEAKVAL);
      } else
#endif
      {
	t->marked = (uint8_t)((t->marked & ~LJ_GC_WEAK) | weak);
	setgcrefr(t->gclist, g->gc.weak);
	setgcref(g->gc.weak, obj2gco(t));
      }
    }
  }
  if (weak == LJ_GC_WEAK)  /* Nothing to mark if both keys/values are weak. */
    return 1;
  if (!(weak & LJ_GC_WEAKVAL)) {  /* Mark array part. */
    MSize i, asize = t->asize;
    for (i = 0; i < asize; i++)
      gc_marktv(g, arrayslot(t, i));
  }
  if (t->hmask > 0) {  /* Mark hash part. */
    Node *node = noderef(t->node);
    MSize i, hmask = t->hmask;
    for (i = 0; i <= hmask; i++) {
      Node *n = &node[i];
      if (!tvisnil(&n->val)) {  /* Mark non-empty slot. */
	lj_assertG(!tvisnil(&n->key), "mark of nil key in non-empty slot");
	if (!(weak & LJ_GC_WEAKKEY)) gc_marktv(g, &n->key);
	if (!(weak & LJ_GC_WEAKVAL)) gc_marktv(g, &n->val);
      }
    }
  }
  return weak;
}